

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::aliasReordering
          (CollationSettings *this,CollationData *data,int32_t *codes,int32_t length,
          uint32_t *ranges,int32_t rangesLength,uint8_t *table,UErrorCode *errorCode)

{
  UBool UVar1;
  bool bVar2;
  int local_38;
  int32_t firstSplitByteRangeIndex;
  int32_t rangesLength_local;
  uint32_t *ranges_local;
  int32_t length_local;
  int32_t *codes_local;
  CollationData *data_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return;
  }
  if (table == (uint8_t *)0x0) {
LAB_002b49cf:
    setReordering(this,data,codes,length,errorCode);
  }
  else {
    if (rangesLength == 0) {
      UVar1 = reorderTableHasSplitBytes(table);
      if (UVar1 != '\0') goto LAB_002b49cf;
    }
    else if (((rangesLength < 2) || ((*ranges & 0xffff) != 0)) ||
            ((ranges[rangesLength + -1] & 0xffff) == 0)) goto LAB_002b49cf;
    if (this->reorderCodesCapacity != 0) {
      uprv_free_63(this->reorderCodes);
      this->reorderCodesCapacity = 0;
    }
    this->reorderTable = table;
    this->reorderCodes = codes;
    this->reorderCodesLength = length;
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (local_38 < rangesLength) {
        bVar2 = (ranges[local_38] & 0xff0000) == 0;
      }
      if (!bVar2) break;
      local_38 = local_38 + 1;
    }
    if (local_38 == rangesLength) {
      this->minHighNoReorder = 0;
      this->reorderRanges = (uint32_t *)0x0;
      this->reorderRangesLength = 0;
    }
    else {
      this->minHighNoReorder = ranges[rangesLength + -1] & 0xffff0000;
      this->reorderRanges = ranges + local_38;
      this->reorderRangesLength = rangesLength - local_38;
    }
  }
  return;
}

Assistant:

void
CollationSettings::aliasReordering(const CollationData &data, const int32_t *codes, int32_t length,
                                   const uint32_t *ranges, int32_t rangesLength,
                                   const uint8_t *table, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(table != NULL &&
            (rangesLength == 0 ?
                    !reorderTableHasSplitBytes(table) :
                    rangesLength >= 2 &&
                    // The first offset must be 0. The last offset must not be 0.
                    (ranges[0] & 0xffff) == 0 && (ranges[rangesLength - 1] & 0xffff) != 0)) {
        // We need to release the memory before setting the alias pointer.
        if(reorderCodesCapacity != 0) {
            uprv_free(const_cast<int32_t *>(reorderCodes));
            reorderCodesCapacity = 0;
        }
        reorderTable = table;
        reorderCodes = codes;
        reorderCodesLength = length;
        // Drop ranges before the first split byte. They are reordered by the table.
        // This then speeds up reordering of the remaining ranges.
        int32_t firstSplitByteRangeIndex = 0;
        while(firstSplitByteRangeIndex < rangesLength &&
                (ranges[firstSplitByteRangeIndex] & 0xff0000) == 0) {
            // The second byte of the primary limit is 0.
            ++firstSplitByteRangeIndex;
        }
        if(firstSplitByteRangeIndex == rangesLength) {
            U_ASSERT(!reorderTableHasSplitBytes(table));
            minHighNoReorder = 0;
            reorderRanges = NULL;
            reorderRangesLength = 0;
        } else {
            U_ASSERT(table[ranges[firstSplitByteRangeIndex] >> 24] == 0);
            minHighNoReorder = ranges[rangesLength - 1] & 0xffff0000;
            reorderRanges = ranges + firstSplitByteRangeIndex;
            reorderRangesLength = rangesLength - firstSplitByteRangeIndex;
        }
        return;
    }
    // Regenerate missing data.
    setReordering(data, codes, length, errorCode);
}